

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

void __thiscall
cmFileAPI::BuildClientRequestInternalTest
          (cmFileAPI *this,ClientRequest *r,
          vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *versions)

{
  uint uVar1;
  pointer pRVar2;
  string local_30;
  
  pRVar2 = (versions->
           super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pRVar2 == (versions->
                  super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
LAB_00382775:
      if ((r->super_Object).Version == 0) {
        NoSupportedVersion_abi_cxx11_(&local_30,(cmFileAPI *)versions,versions);
        std::__cxx11::string::operator=((string *)&r->Error,(string *)&local_30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
      }
      return;
    }
    uVar1 = pRVar2->Major;
    if (((ulong)uVar1 == 1 && pRVar2->Minor < 4) || (uVar1 == 2 && pRVar2->Minor == 0)) {
      (r->super_Object).Version = (ulong)uVar1;
      goto LAB_00382775;
    }
    pRVar2 = pRVar2 + 1;
  } while( true );
}

Assistant:

void cmFileAPI::BuildClientRequestInternalTest(
  ClientRequest& r, std::vector<RequestVersion> const& versions)
{
  // Select a known version from those requested.
  for (RequestVersion const& v : versions) {
    if ((v.Major == 1 && v.Minor <= InternalTestV1Minor) || //
        (v.Major == 2 && v.Minor <= InternalTestV2Minor)) {
      r.Version = v.Major;
      break;
    }
  }
  if (!r.Version) {
    r.Error = NoSupportedVersion(versions);
  }
}